

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O3

uv_os_sock_t create_tcp_socket(void)

{
  uv_stream_t *puVar1;
  uint uVar2;
  int iVar3;
  uv_os_sock_t uVar4;
  uv_os_sock_t extraout_EAX;
  undefined8 uVar5;
  ulong uVar6;
  void *pvVar7;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_stream_t *puVar8;
  int iVar9;
  undefined8 *puVar10;
  long *plVar11;
  uv_connect_cb p_Var12;
  code *pcVar13;
  long *plVar14;
  uv_shutdown_t *puVar15;
  undefined1 *puVar16;
  uv_connect_t *puVar17;
  int64_t eval_b;
  int64_t eval_a;
  int yes;
  long alStack_418 [2];
  undefined1 auStack_408 [16];
  code *pcStack_3f8;
  void *pvStack_3f0;
  undefined1 auStack_3e8 [64];
  void *pvStack_3a8;
  uv_connect_cb ap_Stack_3a0 [2];
  uv__queue *puStack_390;
  uv__queue *puStack_388;
  code *pcStack_380;
  long lStack_370;
  long lStack_368;
  undefined1 auStack_360 [16];
  sockaddr sStack_350;
  long alStack_340 [27];
  code *pcStack_268;
  long lStack_258;
  long lStack_250;
  sockaddr sStack_248;
  long alStack_238 [27];
  code *pcStack_160;
  long lStack_158;
  long lStack_150;
  undefined1 auStack_148 [216];
  uv_stream_t *puStack_70;
  code *pcStack_68;
  undefined8 uStack_58;
  long lStack_50;
  undefined1 auStack_48 [16];
  ulong uStack_38;
  undefined8 local_20;
  void *local_18;
  undefined4 local_c;
  
  uVar2 = socket(2,1,0);
  local_18 = (void *)(long)(int)uVar2;
  local_20 = 0;
  if ((long)local_18 < 0) {
    create_tcp_socket_cold_2();
  }
  else {
    local_c = 1;
    iVar3 = setsockopt(uVar2,1,2,&stack0xfffffffffffffff4,4);
    local_18 = (void *)(long)iVar3;
    local_20 = 0;
    if (local_18 == (void *)0x0) {
      return uVar2;
    }
  }
  puVar8 = (uv_stream_t *)&stack0xffffffffffffffe8;
  puVar10 = &local_20;
  create_tcp_socket_cold_1();
  pcStack_68 = (code *)0x1cd170;
  uStack_38 = (ulong)uVar2;
  auStack_48 = uv_buf_init("PING",4);
  puVar1 = connect_req.handle;
  if (puVar8 == (uv_stream_t *)&connect_req) {
    lStack_50 = (long)(int)puVar10;
    uStack_58 = 0;
    if (lStack_50 != 0) goto LAB_001cd26b;
    connect_cb_called = connect_cb_called + 1;
    pcStack_68 = (code *)0x1cd1d8;
    iVar3 = uv_write(&write_req,connect_req.handle,auStack_48,1,write_cb);
    lStack_50 = (long)iVar3;
    uStack_58 = 0;
    puVar8 = puVar1;
    if (lStack_50 != 0) goto LAB_001cd27a;
    pcStack_68 = (code *)0x1cd20e;
    iVar3 = uv_shutdown(&shutdown_req,puVar1,shutdown_cb);
    lStack_50 = (long)iVar3;
    uStack_58 = 0;
    if (lStack_50 != 0) goto LAB_001cd289;
    pcStack_68 = (code *)0x1cd240;
    iVar3 = uv_read_start(puVar1,alloc_cb,read_cb);
    lStack_50 = (long)iVar3;
    uStack_58 = 0;
    if (lStack_50 == 0) {
      return iVar3;
    }
  }
  else {
    pcStack_68 = (code *)0x1cd26b;
    connect_cb_cold_1();
LAB_001cd26b:
    pcStack_68 = (code *)0x1cd27a;
    connect_cb_cold_2();
LAB_001cd27a:
    pcStack_68 = (code *)0x1cd289;
    connect_cb_cold_3();
LAB_001cd289:
    pcStack_68 = (code *)0x1cd298;
    connect_cb_cold_4();
  }
  pcStack_68 = run_test_tcp_open_twice;
  connect_cb_cold_5();
  pcStack_160 = (code *)0x1cd2b5;
  puStack_70 = puVar8;
  pcStack_68 = (code *)((ulong)puVar10 & 0xffffffff);
  uVar4 = create_tcp_socket();
  pcStack_160 = (code *)0x1cd2bc;
  uVar2 = create_tcp_socket();
  uVar6 = (ulong)uVar2;
  pcStack_160 = (code *)0x1cd2c3;
  uVar5 = uv_default_loop();
  pcStack_160 = (code *)0x1cd2d0;
  iVar3 = uv_tcp_init(uVar5,auStack_148);
  lStack_150 = (long)iVar3;
  lStack_158 = 0;
  if (lStack_150 == 0) {
    pcStack_160 = (code *)0x1cd2fa;
    iVar3 = uv_tcp_open(auStack_148,uVar4);
    lStack_150 = (long)iVar3;
    lStack_158 = 0;
    if (lStack_150 != 0) goto LAB_001cd3ea;
    pcStack_160 = (code *)0x1cd324;
    iVar3 = uv_tcp_open(auStack_148,uVar2);
    lStack_150 = (long)iVar3;
    lStack_158 = -0x10;
    if (lStack_150 != -0x10) goto LAB_001cd3f7;
    pcStack_160 = (code *)0x1cd349;
    iVar3 = close(uVar2);
    lStack_150 = (long)iVar3;
    lStack_158 = 0;
    if (lStack_150 != 0) goto LAB_001cd404;
    pcStack_160 = (code *)0x1cd373;
    uv_close(auStack_148,0);
    pcStack_160 = (code *)0x1cd378;
    uVar5 = uv_default_loop();
    pcStack_160 = (code *)0x1cd382;
    uv_run(uVar5,0);
    pcStack_160 = (code *)0x1cd387;
    uVar6 = uv_default_loop();
    pcStack_160 = (code *)0x1cd39b;
    uv_walk(uVar6,close_walk_cb,0);
    pcStack_160 = (code *)0x1cd3a5;
    uv_run(uVar6,0);
    lStack_150 = 0;
    pcStack_160 = (code *)0x1cd3b3;
    uVar5 = uv_default_loop();
    pcStack_160 = (code *)0x1cd3bb;
    iVar3 = uv_loop_close(uVar5);
    lStack_158 = (long)iVar3;
    if (lStack_150 == lStack_158) {
      pcStack_160 = (code *)0x1cd3d1;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_160 = (code *)0x1cd3ea;
    run_test_tcp_open_twice_cold_1();
LAB_001cd3ea:
    pcStack_160 = (code *)0x1cd3f7;
    run_test_tcp_open_twice_cold_2();
LAB_001cd3f7:
    pcStack_160 = (code *)0x1cd404;
    run_test_tcp_open_twice_cold_3();
LAB_001cd404:
    pcStack_160 = (code *)0x1cd411;
    run_test_tcp_open_twice_cold_4();
  }
  pcStack_160 = run_test_tcp_open_bound;
  run_test_tcp_open_twice_cold_5();
  pcStack_268 = (code *)0x1cd42b;
  pcStack_160 = (code *)uVar6;
  uVar2 = create_tcp_socket();
  pvVar7 = (void *)(ulong)uVar2;
  pcStack_268 = (code *)0x1cd443;
  iVar3 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_248);
  alStack_238[0] = (long)iVar3;
  lStack_258 = 0;
  if (alStack_238[0] == 0) {
    pcStack_268 = (code *)0x1cd468;
    uVar5 = uv_default_loop();
    pcStack_268 = (code *)0x1cd475;
    iVar3 = uv_tcp_init(uVar5,alStack_238);
    lStack_258 = (long)iVar3;
    lStack_250 = 0;
    if (lStack_258 != 0) goto LAB_001cd58e;
    pcStack_268 = (code *)0x1cd4a6;
    iVar3 = bind(uVar2,&sStack_248,0x10);
    lStack_258 = (long)iVar3;
    lStack_250 = 0;
    if (lStack_258 != 0) goto LAB_001cd59d;
    pcStack_268 = (code *)0x1cd4d2;
    iVar3 = uv_tcp_open(alStack_238,uVar2);
    lStack_258 = (long)iVar3;
    lStack_250 = 0;
    if (lStack_258 != 0) goto LAB_001cd5ac;
    pcStack_268 = (code *)0x1cd503;
    iVar3 = uv_listen(alStack_238,0x80,0);
    lStack_258 = (long)iVar3;
    lStack_250 = 0;
    if (lStack_258 != 0) goto LAB_001cd5bb;
    pcStack_268 = (code *)0x1cd528;
    pvVar7 = (void *)uv_default_loop();
    pcStack_268 = (code *)0x1cd53c;
    uv_walk(pvVar7,close_walk_cb,0);
    pcStack_268 = (code *)0x1cd546;
    uv_run(pvVar7,0);
    lStack_258 = 0;
    pcStack_268 = (code *)0x1cd554;
    uVar5 = uv_default_loop();
    pcStack_268 = (code *)0x1cd55c;
    iVar3 = uv_loop_close(uVar5);
    lStack_250 = (long)iVar3;
    if (lStack_258 == lStack_250) {
      pcStack_268 = (code *)0x1cd574;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_268 = (code *)0x1cd58e;
    run_test_tcp_open_bound_cold_1();
LAB_001cd58e:
    pcStack_268 = (code *)0x1cd59d;
    run_test_tcp_open_bound_cold_2();
LAB_001cd59d:
    pcStack_268 = (code *)0x1cd5ac;
    run_test_tcp_open_bound_cold_3();
LAB_001cd5ac:
    pcStack_268 = (code *)0x1cd5bb;
    run_test_tcp_open_bound_cold_4();
LAB_001cd5bb:
    pcStack_268 = (code *)0x1cd5ca;
    run_test_tcp_open_bound_cold_5();
  }
  pcStack_268 = run_test_tcp_open_connected;
  run_test_tcp_open_bound_cold_6();
  pcStack_380 = (code *)0x1cd5f2;
  pcStack_268 = (code *)pvVar7;
  auStack_360 = uv_buf_init("PING",4);
  pcStack_380 = (code *)0x1cd612;
  iVar3 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_350);
  alStack_340[0] = (long)iVar3;
  lStack_370 = 0;
  if (alStack_340[0] == 0) {
    pcStack_380 = (code *)0x1cd637;
    uVar2 = create_tcp_socket();
    pvVar7 = (void *)(ulong)uVar2;
    pcStack_380 = (code *)0x1cd64a;
    iVar3 = connect(uVar2,&sStack_350,0x10);
    alStack_340[0] = (long)iVar3;
    lStack_370 = 0;
    if (alStack_340[0] != 0) goto LAB_001cd867;
    pcStack_380 = (code *)0x1cd66f;
    uVar5 = uv_default_loop();
    pcStack_380 = (code *)0x1cd67c;
    iVar3 = uv_tcp_init(uVar5,alStack_340);
    lStack_370 = (long)iVar3;
    lStack_368 = 0;
    if (lStack_370 != 0) goto LAB_001cd876;
    pcStack_380 = (code *)0x1cd6a8;
    iVar3 = uv_tcp_open(alStack_340,uVar2);
    lStack_370 = (long)iVar3;
    lStack_368 = 0;
    if (lStack_370 != 0) goto LAB_001cd885;
    pcStack_380 = (code *)0x1cd6ea;
    iVar3 = uv_write(&write_req,alStack_340,auStack_360,1,write_cb);
    lStack_370 = (long)iVar3;
    lStack_368 = 0;
    if (lStack_370 != 0) goto LAB_001cd894;
    pcStack_380 = (code *)0x1cd722;
    iVar3 = uv_shutdown(&shutdown_req,alStack_340,shutdown_cb);
    lStack_370 = (long)iVar3;
    lStack_368 = 0;
    if (lStack_370 != 0) goto LAB_001cd8a3;
    pcStack_380 = (code *)0x1cd75a;
    iVar3 = uv_read_start(alStack_340,alloc_cb,read_cb);
    lStack_370 = (long)iVar3;
    lStack_368 = 0;
    if (lStack_370 != 0) goto LAB_001cd8b2;
    pcStack_380 = (code *)0x1cd77f;
    uVar5 = uv_default_loop();
    pcStack_380 = (code *)0x1cd789;
    uv_run(uVar5,0);
    lStack_370 = 1;
    lStack_368 = (long)shutdown_cb_called;
    if (lStack_368 != 1) goto LAB_001cd8c1;
    lStack_370 = 1;
    lStack_368 = (long)write_cb_called;
    if (lStack_368 != 1) goto LAB_001cd8d0;
    lStack_370 = 1;
    lStack_368 = (long)close_cb_called;
    if (lStack_368 != 1) goto LAB_001cd8df;
    pcStack_380 = (code *)0x1cd7fd;
    pvVar7 = (void *)uv_default_loop();
    pcStack_380 = (code *)0x1cd811;
    uv_walk(pvVar7,close_walk_cb,0);
    pcStack_380 = (code *)0x1cd81b;
    uv_run(pvVar7,0);
    lStack_370 = 0;
    pcStack_380 = (code *)0x1cd829;
    uVar5 = uv_default_loop();
    pcStack_380 = (code *)0x1cd831;
    iVar3 = uv_loop_close(uVar5);
    lStack_368 = (long)iVar3;
    if (lStack_370 == lStack_368) {
      pcStack_380 = (code *)0x1cd84d;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_380 = (code *)0x1cd867;
    run_test_tcp_open_connected_cold_1();
LAB_001cd867:
    pcStack_380 = (code *)0x1cd876;
    run_test_tcp_open_connected_cold_2();
LAB_001cd876:
    pcStack_380 = (code *)0x1cd885;
    run_test_tcp_open_connected_cold_3();
LAB_001cd885:
    pcStack_380 = (code *)0x1cd894;
    run_test_tcp_open_connected_cold_4();
LAB_001cd894:
    pcStack_380 = (code *)0x1cd8a3;
    run_test_tcp_open_connected_cold_5();
LAB_001cd8a3:
    pcStack_380 = (code *)0x1cd8b2;
    run_test_tcp_open_connected_cold_6();
LAB_001cd8b2:
    pcStack_380 = (code *)0x1cd8c1;
    run_test_tcp_open_connected_cold_7();
LAB_001cd8c1:
    pcStack_380 = (code *)0x1cd8d0;
    run_test_tcp_open_connected_cold_8();
LAB_001cd8d0:
    pcStack_380 = (code *)0x1cd8df;
    run_test_tcp_open_connected_cold_9();
LAB_001cd8df:
    pcStack_380 = (code *)0x1cd8ee;
    run_test_tcp_open_connected_cold_10();
  }
  plVar14 = &lStack_370;
  plVar11 = &lStack_368;
  pcStack_380 = write_cb;
  run_test_tcp_open_connected_cold_11();
  if (plVar14 == (long *)0x0) {
    puStack_388 = (uv__queue *)0x1cd914;
    write_cb_cold_2();
  }
  else if ((int)plVar11 == 0) {
    write_cb_called = write_cb_called + 1;
    return extraout_EAX;
  }
  iVar3 = (int)plVar11;
  puVar15 = (uv_shutdown_t *)((ulong)plVar11 & 0xffffffff);
  puStack_388 = (uv__queue *)shutdown_cb;
  write_cb_cold_1();
  if (puVar15 == &shutdown_req) {
    puStack_388 = (uv__queue *)(long)iVar3;
    puStack_390 = (uv__queue *)0x0;
    if (puStack_388 == (uv__queue *)0x0) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return iVar3;
    }
  }
  else {
    ap_Stack_3a0[0] = (uv_connect_cb)0x1cd958;
    shutdown_cb_cold_1();
  }
  p_Var12 = (uv_connect_cb)(auStack_3e8 + 0x58);
  ap_Stack_3a0[0] = alloc_cb;
  shutdown_cb_cold_2();
  pvStack_3a8 = (void *)0x10000;
  if ((long)p_Var12 < 0x10001) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0x37fb20;
  }
  puVar16 = auStack_3e8 + 0x48;
  pcVar13 = (code *)(auStack_3e8 + 0x40);
  auStack_3e8._48_8_ = read_cb;
  ap_Stack_3a0[0] = p_Var12;
  alloc_cb_cold_1();
  if (puVar16 == (undefined1 *)0x0) {
    auStack_3e8._24_8_ = (void *)0x1cda38;
    read_cb_cold_4();
LAB_001cda38:
    auStack_3e8._24_8_ = (void *)0x1cda47;
    read_cb_cold_2();
LAB_001cda47:
    auStack_3e8._24_8_ = (void *)0x1cda56;
    read_cb_cold_3();
  }
  else {
    if (-1 < (long)pcVar13) {
      auStack_3e8._48_8_ = (code *)0x4;
      auStack_3e8._40_8_ = pcVar13;
      if (pcVar13 != (code *)0x4) goto LAB_001cda38;
      auStack_3e8._24_8_ = (void *)0x1cd9e8;
      iVar3 = memcmp("PING",(void *)*extraout_RDX_00,4);
      auStack_3e8._48_8_ = SEXT48(iVar3);
      auStack_3e8._40_8_ = (code *)0x0;
      if ((code *)auStack_3e8._48_8_ == (code *)0x0) {
        return iVar3;
      }
      goto LAB_001cda47;
    }
    auStack_3e8._40_8_ = (code *)0xfffffffffffff001;
    auStack_3e8._48_8_ = pcVar13;
    if (pcVar13 == (code *)0xfffffffffffff001) {
      uVar4 = uv_close();
      return uVar4;
    }
  }
  auStack_3e8._24_8_ = run_test_tcp_write_ready;
  read_cb_cold_1();
  iVar9 = (int)&pvStack_3f0;
  pcStack_3f8 = (code *)0x1cda80;
  auStack_3e8._24_8_ = pvVar7;
  iVar3 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_3e8 + 8);
  auStack_3e8._0_8_ = SEXT48(iVar3);
  pvStack_3f0 = (void *)0x0;
  if ((void *)auStack_3e8._0_8_ == (void *)0x0) {
    pcStack_3f8 = (code *)0x1cdaa3;
    uVar2 = create_tcp_socket();
    pvVar7 = (void *)(ulong)uVar2;
    pcStack_3f8 = (code *)0x1cdaaa;
    uVar5 = uv_default_loop();
    pcStack_3f8 = (code *)0x1cdab9;
    iVar3 = uv_tcp_init(uVar5,&client);
    auStack_3e8._0_8_ = SEXT48(iVar3);
    pvStack_3f0 = (void *)0x0;
    if ((void *)auStack_3e8._0_8_ != (void *)0x0) goto LAB_001cdc66;
    pcStack_3f8 = (code *)0x1cdae5;
    iVar3 = uv_tcp_open(&client,uVar2);
    auStack_3e8._0_8_ = SEXT48(iVar3);
    pvStack_3f0 = (void *)0x0;
    if ((void *)auStack_3e8._0_8_ != (void *)0x0) goto LAB_001cdc73;
    pcStack_3f8 = (code *)0x1cdb22;
    iVar3 = uv_tcp_connect(&connect_req,&client,auStack_3e8 + 8,connect1_cb);
    auStack_3e8._0_8_ = SEXT48(iVar3);
    pvStack_3f0 = (void *)0x0;
    if ((void *)auStack_3e8._0_8_ != (void *)0x0) goto LAB_001cdc80;
    pcStack_3f8 = (code *)0x1cdb45;
    uVar5 = uv_default_loop();
    pcStack_3f8 = (code *)0x1cdb4f;
    uv_run(uVar5,0);
    auStack_3e8._0_8_ = (void *)0x1;
    pvStack_3f0 = (void *)(long)shutdown_cb_called;
    if (pvStack_3f0 != (void *)0x1) goto LAB_001cdc8d;
    auStack_3e8._0_8_ = (void *)0x1;
    pvStack_3f0 = (void *)(long)shutdown_requested;
    if (pvStack_3f0 != (void *)0x1) goto LAB_001cdc9a;
    auStack_3e8._0_8_ = (void *)0x1;
    pvStack_3f0 = (void *)(long)connect_cb_called;
    if (pvStack_3f0 != (void *)0x1) goto LAB_001cdca7;
    auStack_3e8._0_8_ = SEXT48(write_cb_called);
    pvStack_3f0 = (void *)0x0;
    if ((long)auStack_3e8._0_8_ < 1) goto LAB_001cdcb4;
    auStack_3e8._0_8_ = (void *)0x1;
    pvStack_3f0 = (void *)(long)close_cb_called;
    if (pvStack_3f0 != (void *)0x1) goto LAB_001cdcc1;
    pcStack_3f8 = (code *)0x1cdc03;
    pvVar7 = (void *)uv_default_loop();
    pcStack_3f8 = (code *)0x1cdc17;
    uv_walk(pvVar7,close_walk_cb,0);
    pcStack_3f8 = (code *)0x1cdc21;
    uv_run(pvVar7,0);
    auStack_3e8._0_8_ = (void *)0x0;
    pcStack_3f8 = (code *)0x1cdc2f;
    uVar5 = uv_default_loop();
    pcStack_3f8 = (code *)0x1cdc37;
    iVar3 = uv_loop_close(uVar5);
    pvStack_3f0 = (void *)(long)iVar3;
    if ((void *)auStack_3e8._0_8_ == pvStack_3f0) {
      pcStack_3f8 = (code *)0x1cdc51;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_3f8 = (code *)0x1cdc66;
    run_test_tcp_write_ready_cold_1();
LAB_001cdc66:
    pcStack_3f8 = (code *)0x1cdc73;
    run_test_tcp_write_ready_cold_2();
LAB_001cdc73:
    pcStack_3f8 = (code *)0x1cdc80;
    run_test_tcp_write_ready_cold_3();
LAB_001cdc80:
    pcStack_3f8 = (code *)0x1cdc8d;
    run_test_tcp_write_ready_cold_4();
LAB_001cdc8d:
    pcStack_3f8 = (code *)0x1cdc9a;
    run_test_tcp_write_ready_cold_5();
LAB_001cdc9a:
    pcStack_3f8 = (code *)0x1cdca7;
    run_test_tcp_write_ready_cold_6();
LAB_001cdca7:
    pcStack_3f8 = (code *)0x1cdcb4;
    run_test_tcp_write_ready_cold_7();
LAB_001cdcb4:
    pcStack_3f8 = (code *)0x1cdcc1;
    run_test_tcp_write_ready_cold_8();
LAB_001cdcc1:
    pcStack_3f8 = (code *)0x1cdcce;
    run_test_tcp_write_ready_cold_9();
  }
  puVar17 = (uv_connect_t *)auStack_3e8;
  pcStack_3f8 = connect1_cb;
  run_test_tcp_write_ready_cold_10();
  puVar8 = connect_req.handle;
  plVar14 = alStack_418;
  pcStack_3f8 = (code *)pvVar7;
  if (puVar17 == &connect_req) {
    auStack_408._0_8_ = SEXT48(iVar9);
    alStack_418[0] = 0;
    if (auStack_408._0_8_ != 0) goto LAB_001cde16;
    connect_cb_called = connect_cb_called + 1;
    uVar5 = uv_default_loop();
    iVar3 = uv_timer_init(uVar5,&tm);
    auStack_408._0_8_ = SEXT48(iVar3);
    alStack_418[0] = 0;
    if (auStack_408._0_8_ != 0) goto LAB_001cde23;
    iVar3 = uv_timer_start(&tm,timer_cb,2000,0);
    auStack_408._0_8_ = SEXT48(iVar3);
    alStack_418[0] = 0;
    if (auStack_408._0_8_ != 0) goto LAB_001cde30;
    auStack_408 = uv_buf_init("P",1);
    iVar3 = uv_write(&write_req,puVar8,auStack_408,1,write1_cb);
    alStack_418[0] = (long)iVar3;
    alStack_418[1] = 0;
    if (alStack_418[0] == 0) {
      iVar3 = uv_read_start(puVar8,alloc_cb,read1_cb);
      alStack_418[0] = (long)iVar3;
      alStack_418[1] = 0;
      if (alStack_418[0] == 0) {
        return iVar3;
      }
      goto LAB_001cde4a;
    }
  }
  else {
    connect1_cb_cold_1();
LAB_001cde16:
    connect1_cb_cold_2();
LAB_001cde23:
    connect1_cb_cold_3();
LAB_001cde30:
    connect1_cb_cold_4();
  }
  connect1_cb_cold_5();
LAB_001cde4a:
  connect1_cb_cold_6();
  iVar3 = uv_is_closing();
  if (iVar3 != 0) {
    return iVar3;
  }
  uVar4 = uv_close(plVar14,0);
  return uVar4;
}

Assistant:

static uv_os_sock_t create_tcp_socket(void) {
  uv_os_sock_t sock;

  sock = socket(AF_INET, SOCK_STREAM, IPPROTO_IP);
#ifdef _WIN32
  ASSERT_NE(sock, INVALID_SOCKET);
#else
  ASSERT_GE(sock, 0);
#endif

#ifndef _WIN32
  {
    /* Allow reuse of the port. */
    int yes = 1;
    int r = setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof yes);
    ASSERT_OK(r);
  }
#endif

  return sock;
}